

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

StackSym * __thiscall GlobOpt::EnsureObjectTypeSym(GlobOpt *this,StackSym *objectSym)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JitArenaAllocator *pJVar4;
  BVSparse<Memory::JitArenaAllocator> *this_00;
  GlobOpt *pGVar5;
  ObjectSymInfo *pOVar6;
  StackSym *typeSym;
  TrackAllocData local_48;
  StackSym *local_20;
  StackSym *objectSym_local;
  GlobOpt *this_local;
  
  local_20 = objectSym;
  objectSym_local = (StackSym *)this;
  bVar2 = StackSym::IsTypeSpec(objectSym);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x2e7,"(!objectSym->IsTypeSpec())","!objectSym->IsTypeSpec()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  StackSym::EnsureObjectInfo(local_20,this->func);
  bVar2 = StackSym::HasObjectTypeSym(local_20);
  if (bVar2) {
    if (this->objectTypeSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                         ,0x2ed,"(this->objectTypeSyms)","this->objectTypeSyms");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    this_local = (GlobOpt *)StackSym::GetObjectTypeSym(local_20);
  }
  else {
    if (this->objectTypeSyms == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      pJVar4 = this->alloc;
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_48,(type_info *)&BVSparse<Memory::JitArenaAllocator>::typeinfo,0,
                 0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                 ,0x2f3);
      pJVar4 = (JitArenaAllocator *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                              pJVar4,&local_48);
      this_00 = (BVSparse<Memory::JitArenaAllocator> *)
                new<Memory::JitArenaAllocator>(0x20,pJVar4,0x4e98c0);
      BVSparse<Memory::JitArenaAllocator>::BVSparse(this_00,this->alloc);
      this->objectTypeSyms = this_00;
    }
    pGVar5 = (GlobOpt *)StackSym::New(TyVar,this->func);
    pOVar6 = StackSym::GetObjectInfo(local_20);
    pOVar6->m_typeSym = (StackSym *)pGVar5;
    BVSparse<Memory::JitArenaAllocator>::Set
              (this->objectTypeSyms,*(BVIndex *)&pGVar5->intConstantToStackSymMap);
    this_local = pGVar5;
  }
  return (StackSym *)this_local;
}

Assistant:

StackSym *
GlobOpt::EnsureObjectTypeSym(StackSym * objectSym)
{
    Assert(!objectSym->IsTypeSpec());

    objectSym->EnsureObjectInfo(this->func);

    if (objectSym->HasObjectTypeSym())
    {
        Assert(this->objectTypeSyms);
        return objectSym->GetObjectTypeSym();
    }

    if (this->objectTypeSyms == nullptr)
    {
        this->objectTypeSyms = JitAnew(this->alloc, BVSparse<JitArenaAllocator>, this->alloc);
    }

    StackSym * typeSym = StackSym::New(TyVar, this->func);

    objectSym->GetObjectInfo()->m_typeSym = typeSym;

    this->objectTypeSyms->Set(typeSym->m_id);

    return typeSym;
}